

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O3

void __thiscall
cinatra::coro_http_server::
set_http_handler<(cinatra::http_method)1,async_simple::coro::Lazy<void>(my_object::*)(cinatra::coro_http_request&,cinatra::coro_http_response&)>
          (coro_http_server *this,string *key,offset_in_my_object_to_subr handler,
          class_type_t<async_simple::coro::Lazy<void>_(my_object::*)(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
          *owner)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  offset_in_my_object_to_subr in_R8;
  string local_98;
  offset_in_my_object_to_subr *local_78;
  undefined8 uStack_70;
  code *pcStack_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  uStack_70 = 0;
  pcStack_68 = (code *)0x0;
  uStack_60 = 0;
  local_78 = (offset_in_my_object_to_subr *)operator_new(0x18);
  *local_78 = handler;
  local_78[1] = (offset_in_my_object_to_subr)owner;
  local_78[2] = in_R8;
  local_98._M_dataplus._M_p = (key->_M_dataplus)._M_p;
  paVar1 = &key->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar1) {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&key->field_2 + 8);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98._M_string_length = key->_M_string_length;
  (key->_M_dataplus)._M_p = (pointer)paVar1;
  key->_M_string_length = 0;
  (key->field_2)._M_local_buf[0] = '\0';
  local_40 = std::
             _Function_handler<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&),_std::_Bind<async_simple::coro::Lazy<void>_(my_object::*(my_object_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>_>
             ::_M_invoke;
  local_58._8_8_ = uStack_70;
  local_48 = std::
             _Function_handler<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&),_std::_Bind<async_simple::coro::Lazy<void>_(my_object::*(my_object_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>_>
             ::_M_manager;
  pcStack_68 = (code *)0x0;
  uStack_60 = 0;
  local_58._M_unused._M_object = local_78;
  set_http_handler<(cinatra::http_method)1,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
            (this,&local_98,
             (function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (pcStack_68 != (code *)0x0) {
    (*pcStack_68)(&local_78,&local_78,3);
  }
  return;
}

Assistant:

void set_http_handler(std::string key, Func handler,
                        util::class_type_t<Func> &owner, Aspects &&...asps) {
    static_assert(std::is_member_function_pointer_v<Func>,
                  "must be member function");
    using return_type = typename util::function_traits<Func>::return_type;
    if constexpr (coro_io::is_lazy_v<return_type>) {
      std::function<async_simple::coro::Lazy<void>(coro_http_request & req,
                                                   coro_http_response & resp)>
          f = std::bind(handler, &owner, std::placeholders::_1,
                        std::placeholders::_2);
      set_http_handler<method...>(std::move(key), std::move(f),
                                  std::forward<Aspects>(asps)...);
    }
    else {
      std::function<void(coro_http_request & req, coro_http_response & resp)>
          f = std::bind(handler, &owner, std::placeholders::_1,
                        std::placeholders::_2);
      set_http_handler<method...>(std::move(key), std::move(f),
                                  std::forward<Aspects>(asps)...);
    }
  }